

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_disable_screensaver.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  long lVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  char *pcVar8;
  long in_RSI;
  int in_EDI;
  uint uVar9;
  bool bVar10;
  undefined8 in_XMM1_Qa;
  _Bool fullscreen;
  _Bool active;
  _Bool done;
  ALLEGRO_EVENT event;
  ALLEGRO_EVENT_QUEUE *events;
  ALLEGRO_FONT *font;
  ALLEGRO_DISPLAY *display;
  int local_70 [8];
  int local_50;
  undefined8 local_28;
  long local_20;
  long local_18;
  undefined4 local_4;
  
  local_4 = 0;
  bVar1 = false;
  bVar3 = 1;
  bVar10 = false;
  if (in_EDI == 2) {
    iVar4 = strcmp(*(char **)(in_RSI + 8),"-fullscreen");
    bVar10 = iVar4 == 0;
  }
  uVar5 = al_install_system(0x5020700,atexit);
  if ((uVar5 & 1) == 0) {
    abort_example("Could not init Allegro.\n");
  }
  al_install_keyboard();
  al_init_font_addon();
  uVar9 = 0;
  if (bVar10) {
    uVar9 = 2;
  }
  al_set_new_display_flags(uVar9 | 0x40);
  local_18 = al_create_display(0x280,0x1e0);
  if (local_18 == 0) {
    abort_example("Could not create display.\n");
  }
  local_20 = al_create_builtin_font();
  if (local_20 == 0) {
    abort_example("Error creating builtin font\n");
  }
  uVar6 = al_create_event_queue();
  local_28 = uVar6;
  uVar7 = al_get_keyboard_event_source();
  al_register_event_source(uVar6,uVar7);
  uVar6 = local_28;
  uVar7 = al_get_display_event_source(local_18);
  al_register_event_source(uVar6,uVar7);
  do {
    uVar6 = al_map_rgb(0,0);
    al_clear_to_color(uVar6,in_XMM1_Qa);
    lVar2 = local_20;
    in_XMM1_Qa = 0x3f800000;
    uVar6 = al_map_rgb_f(0x3f800000);
    pcVar8 = "Inhibited";
    if (bVar3 != 0) {
      pcVar8 = "Normal";
    }
    al_draw_textf(uVar6,in_XMM1_Qa,0,lVar2,0,"Screen saver: %s",pcVar8);
    al_flip_display();
    al_wait_for_event(local_28,local_70);
    if (local_70[0] == 10) {
      if (local_50 == 0x3b) {
        bVar1 = true;
      }
      else if ((local_50 == 0x4b) && (uVar5 = al_inhibit_screensaver(bVar3), (uVar5 & 1) != 0)) {
        bVar3 = bVar3 ^ 1;
      }
    }
  } while (!bVar1);
  al_destroy_font(local_20);
  al_destroy_event_queue(local_28);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_FONT *font;
   ALLEGRO_EVENT_QUEUE *events;
   ALLEGRO_EVENT event;
   bool done = false;
   bool active = true;
   bool fullscreen = false;
 
   if (argc == 2) {
      if (!strcmp(argv[1], "-fullscreen")) {
         fullscreen = true;
      }
   }

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   al_install_keyboard();
   al_init_font_addon();

   al_set_new_display_flags(ALLEGRO_GENERATE_EXPOSE_EVENTS |
      (fullscreen ? ALLEGRO_FULLSCREEN : 0));

   display = al_create_display(640, 480);
   if (!display) {
      abort_example("Could not create display.\n");
   }

   font = al_create_builtin_font();
   if (!font) {
      abort_example("Error creating builtin font\n");
   }

   events = al_create_event_queue();
   al_register_event_source(events, al_get_keyboard_event_source());
   /* For expose events */
   al_register_event_source(events, al_get_display_event_source(display));

   do {
      al_clear_to_color(al_map_rgb(0, 0, 0));
      al_draw_textf(font, al_map_rgb_f(1, 1, 1), 0, 0, 0,
         "Screen saver: %s", active ? "Normal" : "Inhibited");
      al_flip_display();
      al_wait_for_event(events, &event);
      switch (event.type) {
         case ALLEGRO_EVENT_KEY_DOWN:
            if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE)
               done = true;
            else if (event.keyboard.keycode == ALLEGRO_KEY_SPACE) {
               if (al_inhibit_screensaver(active)) {
                  active = !active;
               }
            }
            break;
      }
   } while (!done);

   al_destroy_font(font);
   al_destroy_event_queue(events);

   return 0;
}